

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall GenericModel::setRoleNames(GenericModel *this,QHash<int,_QByteArray> *rNames)

{
  QHash<int,_QByteArray> *this_00;
  GenericModelPrivate *pGVar1;
  GenericModelItem *pGVar2;
  compare_eq_result_container<QHash<int,_QByteArray>,_int,_QByteArray> cVar3;
  undefined8 uVar4;
  GenericModel *local_58;
  undefined1 *local_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  pGVar1 = this->m_dptr;
  this_00 = &pGVar1->m_roleNames;
  cVar3 = QHash<int,QByteArray>::operator==((QHash<int,QByteArray> *)this_00,rNames);
  if (!cVar3) {
    local_48 = std::
               _Function_handler<void_(const_QModelIndex_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/genericmodel.cpp:834:27)>
               ::_M_manager;
    local_40 = std::
               _Function_handler<void_(const_QModelIndex_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/genericmodel.cpp:834:27)>
               ::_M_invoke;
    local_58 = this;
    local_50 = (undefined1 *)&local_58;
    QHash<int,_QByteArray>::operator=(this_00,rNames);
    pGVar2 = pGVar1->root;
    if ((0 < pGVar2->m_rowCount) && (0 < pGVar2->m_colCount)) {
      local_38 = 0xffffffffffffffff;
      local_30 = 0;
      uStack_28 = 0;
      if (local_48 == (code *)0x0) {
        uVar4 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar4);
      }
      (*local_40)(&local_58,&local_38);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  return;
}

Assistant:

void GenericModel::setRoleNames(const QHash<int, QByteArray> &rNames)
{
    Q_D(GenericModel);
    if (d->m_roleNames != rNames) {
        std::function<void(const QModelIndex &)> sendDataChanged;
        sendDataChanged = [this, &sendDataChanged](const QModelIndex &parent) {
            const int rowC = rowCount(parent);
            const int colC = columnCount(parent);
            Q_ASSERT(rowC > 0 && colC > 0);
            for (int r = 0; r < rowC; ++r) {
                for (int c = 0; c < colC; ++c) {
                    const QModelIndex idx = index(r, c, parent);
                    if (hasChildren(idx))
                        sendDataChanged(idx);
                }
            }
            dataChanged(index(0, 0, parent), index(rowC - 1, colC - 1, parent));
        };
        d->m_roleNames = rNames;
        if (d->root->rowCount() > 0 && d->root->columnCount() > 0)
            sendDataChanged(QModelIndex());
    }
}